

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstorageinfo_linux.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_15c56c5::AutoFileDescriptor::AutoFileDescriptor
          (AutoFileDescriptor *this,QString *path,int mode)

{
  int iVar1;
  int *piVar2;
  undefined4 in_register_00000014;
  char *__file;
  long in_FS_OFFSET;
  QByteArray local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QString::toLocal8Bit_helper(&local_38,(QChar *)path,CONCAT44(in_register_00000014,mode));
  __file = local_38.d.ptr;
  if (local_38.d.ptr == (char *)0x0) {
    __file = &QByteArray::_empty;
  }
  do {
    iVar1 = open64(__file,0x80000,0x1ff);
    if (iVar1 != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
    }
  }
  this->fd = iVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

AutoFileDescriptor(const QString &path, int mode = QT_OPEN_RDONLY)
        : fd(qt_safe_open(QFile::encodeName(path), mode))
    {}